

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

Abc_Des_t * Abc_DesCreate(char *pName)

{
  Abc_Des_t *pAVar1;
  size_t sVar2;
  char *__dest;
  st__table *psVar3;
  Vec_Ptr_t *pVVar4;
  Hop_Man_t *pHVar5;
  int nCap;
  
  pAVar1 = (Abc_Des_t *)calloc(1,0x38);
  if (pName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(pName);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pName);
  }
  pAVar1->pName = __dest;
  nCap = 0xdf83f0;
  psVar3 = st__init_table(strcmp,st__strhash);
  pAVar1->tModules = psVar3;
  pVVar4 = Vec_PtrAlloc(nCap);
  pAVar1->vTops = pVVar4;
  pVVar4 = Vec_PtrAlloc(nCap);
  pAVar1->vModules = pVVar4;
  pHVar5 = Hop_ManStart();
  pAVar1->pManFunc = pHVar5;
  pAVar1->pLibrary = (Abc_Des_t *)0x0;
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create the library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Des_t * Abc_DesCreate( char * pName )
{
    Abc_Des_t * p;
    p = ABC_ALLOC( Abc_Des_t, 1 );
    memset( p, 0, sizeof(Abc_Des_t) );
    p->pName    = Abc_UtilStrsav( pName );
    p->tModules = st__init_table( strcmp, st__strhash );
    p->vTops    = Vec_PtrAlloc( 100 );
    p->vModules = Vec_PtrAlloc( 100 );
    p->pManFunc = Hop_ManStart();
    p->pLibrary = NULL;
    return p;
}